

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib643.c
# Opt level: O3

int once(char *URL,_Bool oldstyle)

{
  int iVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  WriteThis pooh;
  WriteThis pooh2;
  char *local_50;
  size_t local_48;
  char *local_40;
  size_t local_38;
  
  local_50 = data;
  sVar2 = strlen(data);
  local_48 = sVar2;
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    curl_mfprintf(_stderr,"curl_easy_init() failed\n");
    goto LAB_00101740;
  }
  lVar4 = curl_mime_init(lVar3);
  if (lVar4 == 0) {
    curl_mfprintf(_stderr,"curl_mime_init() failed\n");
  }
  else {
    lVar5 = curl_mime_addpart(lVar4);
    if (lVar5 == 0) {
      pcVar7 = "curl_mime_addpart(1) failed\n";
    }
    else {
      if (oldstyle) {
        iVar1 = curl_mime_name(lVar5,"sendfile");
        if ((iVar1 != 0) ||
           (iVar1 = curl_mime_data_cb(lVar5,sVar2,read_callback,0,0,&local_50), iVar1 != 0))
        goto LAB_001014bf;
        pcVar7 = "postit2.c";
LAB_00101762:
        iVar1 = curl_mime_filename(lVar5,pcVar7);
        if (iVar1 != 0) goto LAB_001014bf;
      }
      else {
        iVar1 = curl_mime_name(lVar5,"sendfile alternative");
        if ((iVar1 == 0) &&
           (iVar1 = curl_mime_data_cb(lVar5,sVar2,read_callback,0,0,&local_50), iVar1 == 0)) {
          pcVar7 = "file name 2";
          goto LAB_00101762;
        }
LAB_001014bf:
        uVar6 = curl_easy_strerror(iVar1);
        curl_mprintf("curl_mime_xxx(1) = %s\n",uVar6);
      }
      local_40 = data;
      sVar2 = strlen(data);
      local_38 = sVar2;
      lVar5 = curl_mime_addpart(lVar4);
      if (lVar5 == 0) {
        pcVar7 = "curl_mime_addpart(2) failed\n";
      }
      else {
        iVar1 = curl_mime_name(lVar5,"callbackdata");
        if ((iVar1 != 0) ||
           (iVar1 = curl_mime_data_cb(lVar5,sVar2,read_callback,0,0,&local_40), iVar1 != 0)) {
          uVar6 = curl_easy_strerror(iVar1);
          curl_mprintf("curl_mime_xxx(2) = %s\n",uVar6);
        }
        lVar5 = curl_mime_addpart(lVar4);
        if (lVar5 == 0) {
          pcVar7 = "curl_mime_addpart(3) failed\n";
        }
        else {
          iVar1 = curl_mime_name(lVar5,"filename");
          if ((iVar1 != 0) ||
             (iVar1 = curl_mime_data(lVar5,"postit2.c",0xffffffffffffffff), iVar1 != 0)) {
            uVar6 = curl_easy_strerror(iVar1);
            curl_mprintf("curl_mime_xxx(3) = %s\n",uVar6);
          }
          lVar5 = curl_mime_addpart(lVar4);
          if (lVar5 == 0) {
            pcVar7 = "curl_mime_addpart(4) failed\n";
          }
          else {
            iVar1 = curl_mime_name(lVar5,"submit");
            if ((iVar1 != 0) ||
               (iVar1 = curl_mime_data(lVar5,"send",0xffffffffffffffff), iVar1 != 0)) {
              uVar6 = curl_easy_strerror(iVar1);
              curl_mprintf("curl_mime_xxx(4) = %s\n",uVar6);
            }
            lVar5 = curl_mime_addpart(lVar4);
            if (lVar5 != 0) {
              iVar1 = curl_mime_name(lVar5,"somename");
              if (((iVar1 != 0) || (iVar1 = curl_mime_filename(lVar5,"somefile.txt"), iVar1 != 0))
                 || (iVar1 = curl_mime_data(lVar5,"blah blah",9), iVar1 != 0)) {
                uVar6 = curl_easy_strerror(iVar1);
                curl_mprintf("curl_mime_xxx(5) = %s\n",uVar6);
              }
              iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
              if (((iVar1 == 0) && (iVar1 = curl_easy_setopt(lVar3,0x281d,lVar4), iVar1 == 0)) &&
                 ((iVar1 = curl_easy_setopt(lVar3,0x29,1), iVar1 == 0 &&
                  (iVar1 = curl_easy_setopt(lVar3,0x2a,1), iVar1 == 0)))) {
                iVar1 = curl_easy_perform(lVar3);
              }
              curl_easy_cleanup(lVar3);
              curl_mime_free(lVar4);
              return iVar1;
            }
            pcVar7 = "curl_mime_addpart(5) failed\n";
          }
        }
      }
    }
    curl_mfprintf(_stderr,pcVar7);
    curl_mime_free(lVar4);
  }
  curl_easy_cleanup(lVar3);
LAB_00101740:
  curl_global_cleanup();
  return 0x7e;
}

Assistant:

static int once(char *URL, bool oldstyle)
{
  CURL *curl;
  CURLcode res = CURLE_OK;

  curl_mime *mime = NULL;
  curl_mimepart *part = NULL;
  struct WriteThis pooh;
  struct WriteThis pooh2;
  curl_off_t datasize = -1;

  pooh.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh.sizeleft = datasize;

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(1) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the file upload part */
  if(oldstyle) {
    res = curl_mime_name(part, "sendfile");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "postit2.c");
  }
  else {
    /* new style */
    res = curl_mime_name(part, "sendfile alternative");
    if(!res)
      res = curl_mime_data_cb(part, datasize, read_callback,
                              NULL, NULL, &pooh);
    if(!res)
      res = curl_mime_filename(part, "file name 2");
  }

  if(res)
    printf("curl_mime_xxx(1) = %s\n", curl_easy_strerror(res));

  /* Now add the same data with another name and make it not look like
     a file upload but still using the callback */

  pooh2.readptr = data;
#ifndef LIB645
  datasize = (curl_off_t)strlen(data);
#endif
  pooh2.sizeleft = datasize;

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(2) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  /* Fill in the file upload part */
  res = curl_mime_name(part, "callbackdata");
  if(!res)
    res = curl_mime_data_cb(part, datasize, read_callback,
                            NULL, NULL, &pooh2);

  if(res)
    printf("curl_mime_xxx(2) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(3) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }

  /* Fill in the filename field */
  res = curl_mime_name(part, "filename");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x70\x6f\x73\x74\x69\x74\x32\x2e\x63",
#else
                          "postit2.c",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(3) = %s\n", curl_easy_strerror(res));

  /* Fill in a submit field too */
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(4) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "submit");
  if(!res)
    res = curl_mime_data(part,
#ifdef CURL_DOES_CONVERSIONS
                         /* ASCII representation with escape
                            sequences for non-ASCII platforms */
                         "\x73\x65\x6e\x64",
#else
                          "send",
#endif
                          CURL_ZERO_TERMINATED);

  if(res)
    printf("curl_mime_xxx(4) = %s\n", curl_easy_strerror(res));

  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart(5) failed\n");
    curl_mime_free(mime);
    curl_easy_cleanup(curl);
    curl_global_cleanup();
    return TEST_ERR_MAJOR_BAD;
  }
  res = curl_mime_name(part, "somename");
  if(!res)
    res = curl_mime_filename(part, "somefile.txt");
  if(!res)
    res = curl_mime_data(part, "blah blah", 9);

  if(res)
    printf("curl_mime_xxx(5) = %s\n", curl_easy_strerror(res));

  /* First set the URL that is about to receive our POST. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* send a multi-part mimepost */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* include headers in the output */
  test_setopt(curl, CURLOPT_HEADER, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mimepost structure */
  curl_mime_free(mime);

  return res;
}